

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall
edition_unittest::TestExtensionOrderings1::~TestExtensionOrderings1(TestExtensionOrderings1 *this)

{
  ~TestExtensionOrderings1(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestExtensionOrderings1::~TestExtensionOrderings1() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestExtensionOrderings1)
  SharedDtor(*this);
}